

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O2

void __thiscall
cmIncludeDirectoryCommand::GetIncludes
          (cmIncludeDirectoryCommand *this,string *arg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *incs)

{
  long lVar1;
  string inc;
  
  while( true ) {
    do {
      lVar1 = std::__cxx11::string::find((char)arg,10);
    } while (lVar1 == 0);
    if (lVar1 == -1) break;
    std::__cxx11::string::substr((ulong)&inc,(ulong)arg);
    NormalizeInclude(this,&inc);
    if (inc._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(incs,&inc);
    }
    std::__cxx11::string::~string((string *)&inc);
  }
  std::__cxx11::string::substr((ulong)&inc,(ulong)arg);
  NormalizeInclude(this,&inc);
  if (inc._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(incs,&inc);
  }
  std::__cxx11::string::~string((string *)&inc);
  return;
}

Assistant:

void cmIncludeDirectoryCommand::GetIncludes(const std::string &arg,
                                            std::vector<std::string> &incs)
{
  // break apart any line feed arguments
  std::string::size_type pos = 0;
  std::string::size_type lastPos = 0;
  while((pos = arg.find('\n', lastPos)) != std::string::npos)
    {
    if (pos)
      {
      std::string inc = arg.substr(lastPos,pos);
      this->NormalizeInclude(inc);
      if (!inc.empty())
        {
        incs.push_back(inc);
        }
      }
    lastPos = pos + 1;
    }
  std::string inc = arg.substr(lastPos);
  this->NormalizeInclude(inc);
  if (!inc.empty())
    {
    incs.push_back(inc);
    }
}